

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O1

void __thiscall asl::Date::Date(Date *this,String *str,String *fmt)

{
  byte *pbVar1;
  byte bVar2;
  int h;
  int month;
  int s;
  int day;
  int m;
  int iVar3;
  anon_union_16_2_78e7fdac_for_String_2 *paVar4;
  anon_union_16_2_78e7fdac_for_String_2 *__nptr;
  int local_44;
  
  if (fmt->_size == 0) {
    paVar4 = &fmt->field_2;
  }
  else {
    paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)(fmt->field_2)._str;
  }
  if (str->_size == 0) {
    __nptr = &str->field_2;
  }
  else {
    __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(str->field_2)._str;
  }
  local_44 = 0;
  month = 0;
  day = 0;
  h = 0;
  m = 0;
  s = 0;
  do {
    bVar2 = paVar4->_space[0];
    if (bVar2 < 0x59) {
      if (bVar2 < 0x44) {
        iVar3 = 3;
        if (bVar2 != 0) {
          if (bVar2 != 0x3f) {
LAB_00138f77:
            if (__nptr->_space[0] != bVar2) {
              this->_t = 0.0;
              iVar3 = 1;
              goto LAB_00138f94;
            }
          }
          __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)((long)__nptr + 1);
          iVar3 = 0;
        }
      }
      else if (bVar2 == 0x44) {
        day = atoi(__nptr->_space);
        iVar3 = 0;
        bVar2 = __nptr->_space[0];
        while ((byte)(bVar2 - 0x30) < 10) {
          pbVar1 = (byte *)(__nptr->_space + 1);
          __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(__nptr->_space + 1);
          bVar2 = *pbVar1;
        }
      }
      else {
        if (bVar2 != 0x4d) goto LAB_00138f77;
        month = atoi(__nptr->_space);
        iVar3 = 0;
        bVar2 = __nptr->_space[0];
        while ((byte)(bVar2 - 0x30) < 10) {
          pbVar1 = (byte *)(__nptr->_space + 1);
          __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(__nptr->_space + 1);
          bVar2 = *pbVar1;
        }
      }
    }
    else if (bVar2 < 0x6d) {
      if (bVar2 == 0x59) {
        local_44 = atoi(__nptr->_space);
        iVar3 = 0;
        bVar2 = __nptr->_space[0];
        while ((byte)(bVar2 - 0x30) < 10) {
          pbVar1 = (byte *)(__nptr->_space + 1);
          __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(__nptr->_space + 1);
          bVar2 = *pbVar1;
        }
      }
      else {
        if (bVar2 != 0x68) goto LAB_00138f77;
        h = atoi(__nptr->_space);
        iVar3 = 0;
        bVar2 = __nptr->_space[0];
        while ((byte)(bVar2 - 0x30) < 10) {
          pbVar1 = (byte *)(__nptr->_space + 1);
          __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(__nptr->_space + 1);
          bVar2 = *pbVar1;
        }
      }
    }
    else if (bVar2 == 0x6d) {
      m = atoi(__nptr->_space);
      iVar3 = 0;
      bVar2 = __nptr->_space[0];
      while ((byte)(bVar2 - 0x30) < 10) {
        pbVar1 = (byte *)(__nptr->_space + 1);
        __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(__nptr->_space + 1);
        bVar2 = *pbVar1;
      }
    }
    else {
      if (bVar2 != 0x73) goto LAB_00138f77;
      s = atoi(__nptr->_space);
      iVar3 = 0;
      bVar2 = __nptr->_space[0];
      while ((byte)(bVar2 - 0x30) < 10) {
        pbVar1 = (byte *)(__nptr->_space + 1);
        __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(__nptr->_space + 1);
        bVar2 = *pbVar1;
      }
    }
LAB_00138f94:
    paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)((long)paVar4 + 1);
    if (iVar3 != 0) {
      if (iVar3 == 3) {
        construct(this,LOCAL,local_44,month,day,h,m,s);
      }
      return;
    }
  } while( true );
}

Assistant:

Date::Date(const String& str, const String& fmt)
{
	const char* f = fmt;
	const char* s = str;
	int         year = 0, month = 0, day = 0, hour = 0, minute = 0, second = 0;

	while (char c = *f++)
	{
		switch (c)
		{
		case 'Y':
			year = parseSkipNumber(s);
			break;
		case 'D':
			day = parseSkipNumber(s);
			break;
		case 'M':
			month = parseSkipNumber(s);
			break;
		case 'h':
			hour = parseSkipNumber(s);
			break;
		case 'm':
			minute = parseSkipNumber(s);
			break;
		case 's':
			second = parseSkipNumber(s);
			break;
		default:
			if (c != '?' && *s != c)
			{
				_t = 0;
				return;
			}
			s++;
		}
	}
	construct(LOCAL, year, month, day, hour, minute, second);
}